

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool cmsys::SystemTools::ParseURLProtocol(string *URL,string *protocol,string *dataglom,bool decode)

{
  bool bVar1;
  string local_2d0;
  string local_2b0;
  string local_290;
  undefined4 local_270;
  undefined1 local_260 [8];
  RegularExpression urlRe;
  bool decode_local;
  string *dataglom_local;
  string *protocol_local;
  string *URL_local;
  
  urlRe._559_1_ = decode;
  RegularExpression::RegularExpression((RegularExpression *)local_260,"([a-zA-Z0-9]*)://(.*)");
  bVar1 = RegularExpression::find((RegularExpression *)local_260,URL);
  if (bVar1) {
    RegularExpression::match_abi_cxx11_(&local_290,(RegularExpression *)local_260,1);
    std::__cxx11::string::operator=((string *)protocol,(string *)&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    RegularExpression::match_abi_cxx11_(&local_2b0,(RegularExpression *)local_260,2);
    std::__cxx11::string::operator=((string *)dataglom,(string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_2b0);
    if ((urlRe._559_1_ & 1) != 0) {
      DecodeURL(&local_2d0,dataglom);
      std::__cxx11::string::operator=((string *)dataglom,(string *)&local_2d0);
      std::__cxx11::string::~string((string *)&local_2d0);
    }
    URL_local._7_1_ = true;
  }
  else {
    URL_local._7_1_ = false;
  }
  local_270 = 1;
  RegularExpression::~RegularExpression((RegularExpression *)local_260);
  return URL_local._7_1_;
}

Assistant:

bool SystemTools::ParseURLProtocol(const std::string& URL,
                                   std::string& protocol,
                                   std::string& dataglom, bool decode)
{
  // match 0 entire url
  // match 1 protocol
  // match 2 dataglom following protocol://
  kwsys::RegularExpression urlRe(VTK_URL_PROTOCOL_REGEX);

  if (!urlRe.find(URL))
    return false;

  protocol = urlRe.match(1);
  dataglom = urlRe.match(2);

  if (decode) {
    dataglom = DecodeURL(dataglom);
  }

  return true;
}